

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O3

void __thiscall arangodb::velocypack::ArrayIterator::ArrayIterator(ArrayIterator *this,Slice slice)

{
  ValueLength VVar1;
  uint8_t *puVar2;
  size_t __n;
  uint8_t *local_10;
  
  (this->_slice)._start = slice._start;
  this->_current = (uint8_t *)0x0;
  this->_size = 0;
  this->_position = 0;
  local_10 = slice._start;
  if (SliceStaticData::TypeMap[*slice._start] == Array) {
    VVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::arrayLength
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &local_10);
    this->_size = VVar1;
    puVar2 = first(this);
    this->_current = puVar2;
    return;
  }
  velocypack::ArrayIterator();
  __n = strlen((char *)slice._start);
  if (__n <= ((ulong)this->_current ^ 0x7fffffffffffffff)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (char *)slice._start,__n);
    return;
  }
  std::__throw_length_error("basic_string::append");
}

Assistant:

explicit ArrayIterator(Slice slice)
      : _slice{slice}, _current{nullptr}, _size{0}, _position{0} {
    auto const head = slice.head();
    if (VELOCYPACK_UNLIKELY(slice.type(head) != ValueType::Array)) {
      throw Exception{Exception::InvalidValueType, "Expecting Array slice"};
    }
    _size = slice.arrayLength();
    _current = first();
  }